

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

uint32 __thiscall Func::GetInstrCount(Func *this)

{
  Instr **ppIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint32 uVar5;
  Instr *pIVar6;
  Instr *pIVar7;
  
  pIVar7 = this->m_headInstr;
  uVar5 = 0;
  if (pIVar7 != (Instr *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIVar6 = (Instr *)0x0;
    do {
      if ((pIVar6 != (Instr *)0x0) && (pIVar6->m_next != pIVar7)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x4a1,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      uVar5 = uVar5 + 1;
      ppIVar1 = &pIVar7->m_next;
      pIVar6 = pIVar7;
      pIVar7 = *ppIVar1;
    } while (*ppIVar1 != (Instr *)0x0);
  }
  return uVar5;
}

Assistant:

uint32
Func::GetInstrCount()
{
    uint instrCount = 0;

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instrCount++;
    }NEXT_INSTR_IN_FUNC;

    return instrCount;
}